

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-arch.h
# Opt level: O2

bool operator==(string *str,LLM_TN_IMPL *tn)

{
  __type _Var1;
  string local_30;
  
  LLM_TN_IMPL::str_abi_cxx11_(&local_30,tn);
  _Var1 = std::operator==(str,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

bool operator==(const std::string & str, const LLM_TN_IMPL & tn) {
        return str == tn.str();
    }